

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRotationGate1.hpp
# Opt level: O0

void __thiscall
qclab::qgates::QRotationGate1<double>::QRotationGate1
          (QRotationGate1<double> *this,int qubit,real_type cos,real_type sin,bool fixed)

{
  bool fixed_local;
  real_type sin_local;
  real_type cos_local;
  int qubit_local;
  QRotationGate1<double> *this_local;
  
  QGate1<double>::QGate1(&this->super_QGate1<double>,qubit);
  QAdjustable::QAdjustable((QAdjustable *)&(this->super_QGate1<double>).field_0xc,fixed);
  (this->super_QGate1<double>).super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0016c0c0;
  QRotation<double>::QRotation(&this->rotation_,cos,sin);
  return;
}

Assistant:

QRotationGate1( const int qubit , const real_type cos ,
                        const real_type sin , const bool fixed = false )
        : QGate1< T >( qubit )
        , rotation_( cos , sin )
        , QAdjustable( fixed )
        { }